

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O0

void binbuf_print(_binbuf *x)

{
  bool bVar1;
  bool bVar2;
  int newline;
  int startedpost;
  int i;
  _binbuf *x_local;
  
  bVar1 = false;
  bVar2 = true;
  for (newline = 0; newline < x->b_n; newline = newline + 1) {
    if (bVar2) {
      if (bVar1) {
        endpost();
      }
      startpost("");
      bVar1 = true;
    }
    postatom(1,x->b_vec + newline);
    bVar2 = x->b_vec[newline].a_type == A_SEMI;
  }
  if (bVar1) {
    endpost();
  }
  return;
}

Assistant:

void binbuf_print(const t_binbuf *x)
{
    int i, startedpost = 0, newline = 1;
    for (i = 0; i < x->b_n; i++)
    {
        if (newline)
        {
            if (startedpost) endpost();
            startpost("");
            startedpost = 1;
        }
        postatom(1, x->b_vec + i);
        if (x->b_vec[i].a_type == A_SEMI)
            newline = 1;
        else newline = 0;
    }
    if (startedpost) endpost();
}